

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io-test.c++:171:11)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_io_test_c__:171:11)>
      *this)

{
  anon_class_24_3_98542d89 *paVar1;
  uchar *puVar2;
  size_t sVar3;
  Array<unsigned_char> local_48;
  InputStream local_28;
  uchar *local_20;
  size_t sStack_18;
  size_t local_10;
  
  paVar1 = (this->func).readAllBytes;
  local_20 = paVar1->textSlice->ptr;
  sStack_18 = paVar1->textSlice->size_;
  local_10 = *paVar1->blockSize;
  local_28._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_001b9800;
  InputStream::readAllBytes(&local_48,&local_28,*paVar1->limit);
  BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&local_28);
  sVar3 = local_48.size_;
  puVar2 = local_48.ptr;
  if (local_48.ptr != (uchar *)0x0) {
    local_48.ptr = (uchar *)0x0;
    local_48.size_ = 0;
    (**(local_48.disposer)->_vptr_ArrayDisposer)(local_48.disposer,puVar2,1,sVar3,sVar3,0);
  }
  return;
}

Assistant:

void run() override {
    func();
  }